

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMErrorImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMErrorImpl::DOMErrorImpl
          (DOMErrorImpl *this,ErrorSeverity severity,XMLCh *type,XMLCh *message,void *relatedData)

{
  (this->super_DOMError)._vptr_DOMError = (_func_int **)0x3fe000;
  this->fAdoptLocation = false;
  this->fSeverity = severity;
  this->fMessage = message;
  this->fLocation = (DOMLocator *)0x0;
  this->fType = type;
  this->fRelatedData = relatedData;
  return;
}

Assistant:

DOMErrorImpl::DOMErrorImpl(const ErrorSeverity severity,
                           const XMLCh* type,
                           const XMLCh* message,
                           void* relatedData) :
fAdoptLocation(false)
, fSeverity(severity)
, fMessage(message)
, fLocation(0)
, fType(type)
, fRelatedData(relatedData)
{

}